

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O2

int __thiscall Fl_Tabs::handle(Fl_Tabs *this,int event)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Fl_Widget *in_RAX;
  Fl_Widget *pFVar5;
  Fl_Widget **ppFVar6;
  Fl_Tabs *pFVar7;
  int iVar8;
  int iStack_30;
  Fl_Widget_Tracker wp;
  
  wp.wp_ = in_RAX;
  switch(event) {
  case 1:
    iVar4 = tab_height(this);
    iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_ + iVar4;
    if (iVar4 < 0) {
      if (iVar3 + (this->super_Fl_Group).super_Fl_Widget.h_ <= Fl::e_y)
      goto switchD_001c9f1a_caseD_2;
    }
    else if (Fl::e_y <= iVar3) goto switchD_001c9f1a_caseD_2;
    iStack_30 = 1;
    event = iStack_30;
    goto LAB_001ca20c;
  case 2:
  case 5:
switchD_001c9f1a_caseD_2:
    pFVar5 = which(this,Fl::e_x,Fl::e_y);
    if (event != 2) {
      push(this,pFVar5);
      return 1;
    }
    push(this,(Fl_Widget *)0x0);
    if (pFVar5 != (Fl_Widget *)0x0) {
      iVar4 = Fl::visible_focus();
      if ((iVar4 != 0) && ((Fl_Tabs *)Fl::focus_ != this)) {
        Fl::focus((Fl_Widget *)this);
        redraw_tabs(this);
      }
      iVar4 = value(this,pFVar5);
      if ((iVar4 != 0) || (((this->super_Fl_Group).super_Fl_Widget.when_ & 2) != 0)) {
        Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,pFVar5);
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
        *(byte *)puVar1 = (byte)*puVar1 | 0x80;
        Fl_Widget::do_callback((Fl_Widget *)this);
        Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
        if (wp.wp_ == (Fl_Widget *)0x0) {
          return 1;
        }
      }
    }
    Fl_Tooltip::current(pFVar5);
    return 1;
  case 6:
  case 7:
    iVar4 = Fl::visible_focus();
    if ((((iVar4 != 0) && ((uint)Fl::e_number < 0xd)) &&
        ((0x11c4U >> (Fl::e_number & 0x1fU) & 1) != 0)) && (redraw_tabs(this), Fl::e_number != 6)) {
      return (uint)(Fl::e_number != 7);
    }
    break;
  case 8:
    if (Fl::e_keysym == 0xff54) {
      Fl_Widget::redraw((Fl_Widget *)this);
      iStack_30 = 6;
      event = iStack_30;
      goto LAB_001ca20c;
    }
    if (Fl::e_keysym == 0xff53) {
      iVar4 = (this->super_Fl_Group).children_;
      if (iVar4 == 0) {
        return 0;
      }
      pFVar5 = Fl_Group::child(&this->super_Fl_Group,iVar4 + -1);
      if ((pFVar5->flags_ & 2) == 0) {
        return 0;
      }
      iVar4 = 1;
      while ((iVar4 + -1 < (this->super_Fl_Group).children_ &&
             (pFVar5 = Fl_Group::child(&this->super_Fl_Group,iVar4 + -1), (pFVar5->flags_ & 2) != 0)
             )) {
        iVar4 = iVar4 + 1;
      }
    }
    else {
      if (Fl::e_keysym != 0xff51) {
        iStack_30 = 8;
        event = iStack_30;
        goto LAB_001ca20c;
      }
      if ((this->super_Fl_Group).children_ == 0) {
        return 0;
      }
      ppFVar6 = Fl_Group::array(&this->super_Fl_Group);
      if (((*ppFVar6)->flags_ & 2) == 0) {
        return 0;
      }
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        iVar3 = iVar4 + 1;
        if ((this->super_Fl_Group).children_ <= iVar3) break;
        pFVar5 = Fl_Group::child(&this->super_Fl_Group,iVar3);
      } while ((pFVar5->flags_ & 2) != 0);
    }
    pFVar5 = Fl_Group::child(&this->super_Fl_Group,iVar4);
    value(this,pFVar5);
    goto LAB_001ca231;
  case 0xb:
    iVar4 = Fl_Group::handle(&this->super_Fl_Group,0xb);
    pFVar5 = Fl_Tooltip::widget_;
    iVar3 = tab_height(this);
    iVar8 = (this->super_Fl_Group).super_Fl_Widget.y_ + iVar3;
    if (iVar3 < 0) {
      if (Fl::e_y < iVar8 + (this->super_Fl_Group).super_Fl_Widget.h_) {
        return iVar4;
      }
    }
    else if (iVar8 < Fl::e_y) {
      return iVar4;
    }
    pFVar7 = (Fl_Tabs *)which(this,Fl::e_x,Fl::e_y);
    if (pFVar7 == (Fl_Tabs *)0x0) {
      pFVar7 = this;
    }
    if (pFVar7 != (Fl_Tabs *)pFVar5) {
      (*Fl_Tooltip::enter)((Fl_Widget *)pFVar7);
      return iVar4;
    }
    return iVar4;
  case 0xc:
    iVar4 = 0;
    do {
      if ((this->super_Fl_Group).children_ <= iVar4) {
        iStack_30 = 0xc;
        event = iStack_30;
        goto LAB_001ca20c;
      }
      pFVar5 = Fl_Group::child(&this->super_Fl_Group,iVar4);
      iVar3 = Fl_Widget::test_shortcut((pFVar5->label_).value,false);
      iVar4 = iVar4 + 1;
    } while (iVar3 == 0);
    uVar2 = pFVar5->flags_;
    value(this,pFVar5);
    if ((uVar2 & 2) == 0) goto LAB_001ca235;
LAB_001ca231:
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
LAB_001ca235:
    Fl_Widget::do_callback((Fl_Widget *)this);
    return 1;
  case 0x10:
    value(this);
  }
LAB_001ca20c:
  iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
  return iVar4;
}

Assistant:

int Fl_Tabs::handle(int event) {

  Fl_Widget *o;
  int i;

  switch (event) {

  case FL_PUSH: {
    int H = tab_height();
    if (H >= 0) {
      if (Fl::event_y() > y()+H) return Fl_Group::handle(event);
    } else {
      if (Fl::event_y() < y()+h()+H) return Fl_Group::handle(event);
    }}
    /* FALLTHROUGH */
  case FL_DRAG:
  case FL_RELEASE:
    o = which(Fl::event_x(), Fl::event_y());
    if (event == FL_RELEASE) {
      push(0);
      if (o && Fl::visible_focus() && Fl::focus()!=this) {
        Fl::focus(this);
        redraw_tabs();
      }
      if (o &&                              // Released on a tab and..
          (value(o) ||                      // tab changed value or..
	   (when()&(FL_WHEN_NOT_CHANGED))   // ..no change but WHEN_NOT_CHANGED set,
	  )                                 // handles FL_WHEN_RELEASE_ALWAYS too.
	 ) {
        Fl_Widget_Tracker wp(o);
        set_changed();
	do_callback();
	if (wp.deleted()) return 1;
      }
      Fl_Tooltip::current(o);
    } else {
      push(o);
    }
    return 1;
  case FL_MOVE: {
    int ret = Fl_Group::handle(event);
    Fl_Widget *o = Fl_Tooltip::current(), *n = o;
    int H = tab_height();
    if ( (H>=0) && (Fl::event_y()>y()+H) )
      return ret;
    else if ( (H<0) && (Fl::event_y() < y()+h()+H) )
      return ret;
    else {
      n = which(Fl::event_x(), Fl::event_y());
      if (!n) n = this;
    }
    if (n!=o)
      Fl_Tooltip::enter(n);
    return ret; }
  case FL_FOCUS:
  case FL_UNFOCUS:
    if (!Fl::visible_focus()) return Fl_Group::handle(event);
    if (Fl::event() == FL_RELEASE ||
	Fl::event() == FL_SHORTCUT ||
	Fl::event() == FL_KEYBOARD ||
	Fl::event() == FL_FOCUS ||
	Fl::event() == FL_UNFOCUS) {
      redraw_tabs();
      if (Fl::event() == FL_FOCUS) return Fl_Group::handle(event);
      if (Fl::event() == FL_UNFOCUS) return 0;
      else return 1;
    } else return Fl_Group::handle(event);
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
      case FL_Left:
	if (!children()) return 0;
	if (child(0)->visible()) return 0;
	for (i = 1; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i - 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Right:
	if (!children()) return 0;
	if (child(children() - 1)->visible()) return 0;
	for (i = 0; i < children(); i ++)
	  if (child(i)->visible()) break;
	value(child(i + 1));
	set_changed();
	do_callback();
        return 1;
      case FL_Down:
        redraw();
        return Fl_Group::handle(FL_FOCUS);
      default:
        break;
    }
    return Fl_Group::handle(event);
  case FL_SHORTCUT:
    for (i = 0; i < children(); ++i) {
      Fl_Widget *c = child(i);
      if (c->test_shortcut(c->label())) {
        char sc = !c->visible();
        value(c);
        if (sc) set_changed();
        do_callback();
        return 1;
      }
    }
    return Fl_Group::handle(event);
  case FL_SHOW:
    value(); // update visibilities and fall through
  default:
    return Fl_Group::handle(event);

  }
}